

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::value::matrix4d> *this,double t)

{
  Sample local_a0;
  
  local_a0.value.m[0][0] = 1.0;
  local_a0.value.m[0][1] = 0.0;
  local_a0.value.m[0][2] = 0.0;
  local_a0.value.m[0][3] = 0.0;
  local_a0.value.m[1][0] = 0.0;
  local_a0.value.m[1][1] = 1.0;
  local_a0.value.m[1][2] = 0.0;
  local_a0.value.m[1][3] = 0.0;
  local_a0.value.m[2][0] = 0.0;
  local_a0.value.m[2][1] = 0.0;
  local_a0.value.m[2][2] = 1.0;
  local_a0.value.m[2][3] = 0.0;
  local_a0.value.m[3][0] = 0.0;
  local_a0.value.m[3][1] = 0.0;
  local_a0.value.m[3][2] = 0.0;
  local_a0.value.m[3][3] = 1.0;
  local_a0.blocked = true;
  local_a0.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>>
              *)this,&local_a0);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }